

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

void __thiscall cppcms::widgets::checkbox::load(checkbox *this)

{
  context *in_RSI;
  
  load((checkbox *)
       ((long)&(this->super_base_html_input)._vptr_base_html_input +
       (long)(this->super_base_html_input)._vptr_base_html_input[-4]),in_RSI);
  return;
}

Assistant:

void checkbox::load(http::context &context)
{
	pre_load(context);
	set(true);
	std::pair<http::request::form_type::const_iterator,http::request::form_type::const_iterator> 
		range=context.request().post_or_get().equal_range(name());
	value(false);
	while(range.first != range.second) {
		if(range.first->second == identification_) {
			value(true);
			break;
		}
		++range.first;
	}
}